

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

char * poptBadOption(poptContext con,uint flags)

{
  poptContext local_30;
  char *local_28;
  char *badOpt;
  optionStackEntry *os;
  uint flags_local;
  poptContext con_local;
  
  local_28 = (char *)0x0;
  if (con != (poptContext)0x0) {
    if (con->execFail == (char *)0x0) {
      local_30 = con;
      if ((flags & 1) == 0) {
        local_30 = (poptContext)con->os;
      }
      local_28 = local_30->optionStack[0].argv[local_30->optionStack[0].next + -1];
    }
    else {
      local_28 = con->execFail;
    }
  }
  return local_28;
}

Assistant:

const char * poptBadOption(poptContext con, unsigned int flags)
{
    struct optionStackEntry * os = NULL;
    const char *badOpt = NULL;

    if (con != NULL) {
       /* Stupid hack to return something semi-meaningful from exec failure */
       if (con->execFail) {
           badOpt = con->execFail;
       } else {
           os = (flags & POPT_BADOPTION_NOALIAS) ? con->optionStack : con->os;
           badOpt = os->argv[os->next - 1];
       }
    }

    return badOpt;
}